

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::write_macros_to_file_for_debug(CTcTokenizer *this,CVmFile *fp)

{
  long lVar1;
  long lVar2;
  uint32_t tmp;
  long lVar3;
  long lVar4;
  char b [4];
  write_macro_ctx_t ctx;
  undefined8 local_48;
  CVmFile **local_40;
  CVmFile *local_38;
  undefined8 local_30;
  
  lVar3 = ftell((FILE *)fp->fp_);
  lVar1 = fp->seek_base_;
  local_48 = (code *)((ulong)local_48._4_4_ << 0x20);
  CVmFile::write_bytes(fp,(char *)&local_48,4);
  local_40 = &local_38;
  local_30 = 0;
  local_48 = write_macros_cb;
  local_38 = fp;
  (*this->defines_->_vptr_CTcMacroTable[5])(this->defines_,enum_defines_cb,&local_48);
  lVar4 = ftell((FILE *)fp->fp_);
  lVar2 = fp->seek_base_;
  fseek((FILE *)fp->fp_,(lVar3 - lVar1) + lVar2,0);
  local_48 = (code *)CONCAT44(local_48._4_4_,(undefined4)local_30);
  CVmFile::write_bytes(fp,(char *)&local_48,4);
  fseek((FILE *)fp->fp_,(lVar4 - lVar2) + fp->seek_base_,0);
  return;
}

Assistant:

void CTcTokenizer::write_macros_to_file_for_debug(CVmFile *fp)
{
    long pos;
    long endpos;
    write_macro_ctx_t ctx;

    /* write a placeholder for the symbol count */
    pos = fp->get_pos();
    fp->write_uint4(0);

    /* write the symbols */
    ctx.fp = fp;
    ctx.cnt = 0;
    enum_defines(&write_macros_cb, &ctx);

    /* go back and fix up the symbol count */
    endpos = fp->get_pos();
    fp->set_pos(pos);
    fp->write_uint4(ctx.cnt);

    /* seek back to where we left off */
    fp->set_pos(endpos);
}